

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

bool __thiscall rlist::listAppend(rlist *this,void *node)

{
  listNode *plVar1;
  listNode *plVar2;
  
  plVar2 = this->rl->head;
  if (plVar2 == (listNode *)0x0) {
    plVar2 = (listNode *)0x0;
  }
  else {
    plVar1 = plVar2;
    if (plVar2->next != (listNode *)0x0) {
      do {
        plVar2 = plVar1;
        plVar1 = plVar2->next;
      } while (plVar2->next != (listNode *)0x0);
      this->view = plVar2;
    }
  }
  this->view = plVar2;
  if (plVar2 == (listNode *)0x0) {
    this->rl->head = (listNode *)node;
  }
  else {
    plVar2->next = (listNode *)node;
    *(listNode **)node = plVar2;
    *(undefined8 *)((long)node + 8) = 0;
  }
  return true;
}

Assistant:

listNode * rlist::listLast(){
    if(rl->head!=NULL){
        if(rl->head->next!=NULL){
            view=rl->head;
            while(view->next!=NULL){
                view=view->next;
            }
            return view;
        }else{
            return rl->head;
        }
    }
    return NULL;
}